

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O0

int __thiscall miniros::TransportTCP::listen(TransportTCP *this,int __fd,int __n)

{
  sa_family_t sVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong uVar7;
  bool enabled_1;
  bool enabled;
  sockaddr_in *address_1;
  sockaddr_in6 *address;
  TransportTCP *in_stack_000001d8;
  undefined8 in_stack_ffffffffffffff08;
  LogLocation *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *in_stack_ffffffffffffff28;
  void *pvVar8;
  undefined4 in_stack_ffffffffffffff30;
  Level LVar9;
  Level in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  string *name;
  LogLocation *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  uint32_t local_a4;
  undefined8 *local_a0;
  undefined1 local_89 [36];
  undefined1 local_65;
  undefined1 local_51 [33];
  sockaddr_storage *local_30;
  sockaddr_storage *local_28;
  int local_18;
  int local_14;
  TransportTCP *local_10;
  undefined1 local_1;
  undefined7 extraout_var;
  
  LVar9 = (Level)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  this->is_server_ = true;
  local_18 = __n;
  local_14 = __fd;
  local_10 = this;
  std::function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)>::operator=
            ((function<void_(const_std::shared_ptr<miniros::TransportTCP>_&)> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
            );
  if ((s_use_ipv6_ & 1) == 0) {
    iVar4 = socket(2,1,0);
    this->sock_ = iVar4;
    local_30 = &this->server_address_;
    local_30->ss_family = 2;
    bVar2 = Transport::isOnlyLocalhostAllowed(&this->super_Transport);
    if (bVar2) {
      local_a4 = htonl(0x7f000001);
    }
    else {
      local_a4 = 0;
    }
    *(uint32_t *)(local_30->__ss_padding + 2) = local_a4;
    uVar3 = htons((uint16_t)local_14);
    *(uint16_t *)local_30->__ss_padding = uVar3;
    this->sa_len_ = 0x10;
  }
  else {
    iVar4 = socket(10,1,0);
    this->sock_ = iVar4;
    local_28 = &this->server_address_;
    local_28->ss_family = 10;
    bVar2 = Transport::isOnlyLocalhostAllowed(&this->super_Transport);
    if (bVar2) {
      local_a0 = (undefined8 *)&in6addr_loopback;
    }
    else {
      local_a0 = (undefined8 *)&in6addr_any;
    }
    *(undefined8 *)(local_28->__ss_padding + 6) = *local_a0;
    *(undefined8 *)(local_28->__ss_padding + 0xe) = local_a0[1];
    uVar3 = htons((uint16_t)local_14);
    *(uint16_t *)local_28->__ss_padding = uVar3;
    this->sa_len_ = 0x1c;
  }
  if (this->sock_ == -1) {
    if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    if (((listen::loc.initialized_ ^ 0xffU) & 1) != 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_51;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (allocator<char> *)in_stack_ffffffffffffff40);
      console::initializeLogLocation
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      std::__cxx11::string::~string((string *)(local_51 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_51);
    }
    if (listen::loc.level_ != Error) {
      console::setLogLocationLevel(in_stack_ffffffffffffff10,LVar9);
      console::checkLogLocationEnabled
                ((LogLocation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    local_65 = (listen::loc.logger_enabled_ & 1U) != 0;
    uVar7 = 0;
    if ((bool)local_65) {
      pvVar8 = listen::loc.logger_;
      LVar9 = listen::loc.level_;
      pcVar6 = last_socket_error_string();
      console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x193,"bool miniros::TransportTCP::listen(int, int, const AcceptCallback &)",
                     "socket() failed with error [%s]",pcVar6);
      uVar7 = extraout_RAX;
    }
    local_1 = 0;
  }
  else {
    iVar4 = bind(this->sock_,(sockaddr *)&this->server_address_,this->sa_len_);
    if (iVar4 < 0) {
      if (((CONCAT71(0x6410,console::g_initialized) ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
            ::loc.initialized_ ^ 0xffU) & 1) != 0) {
        name = (string *)local_89;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff50,
                   (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (allocator<char> *)in_stack_ffffffffffffff40);
        console::initializeLogLocation(in_stack_ffffffffffffff40,name,in_stack_ffffffffffffff34);
        std::__cxx11::string::~string((string *)(local_89 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_89);
      }
      if (listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
          loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_ffffffffffffff10,LVar9);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
      uVar7 = 0;
      if ((listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)::
           loc.logger_enabled_ & 1U) != 0) {
        pvVar8 = listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                 ::loc.logger_;
        LVar9 = listen(int,int,std::function<void(std::shared_ptr<miniros::TransportTCP>const&)>const&)
                ::loc.level_;
        pcVar6 = last_socket_error_string();
        console::print((FilterBase *)0x0,pvVar8,(Level)(ulong)LVar9,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                       ,0x19a,"bool miniros::TransportTCP::listen(int, int, const AcceptCallback &)"
                       ,"bind() failed with error [%s]",pcVar6);
        uVar7 = extraout_RAX_00;
      }
      local_1 = 0;
    }
    else {
      ::listen(this->sock_,local_18);
      getsockname(this->sock_,(sockaddr *)&this->server_address_,&this->sa_len_);
      sVar1 = (this->server_address_).ss_family;
      if (sVar1 == 2) {
        uVar3 = ntohs(*(uint16_t *)(this->server_address_).__ss_padding);
        this->server_port_ = (uint)uVar3;
      }
      else if (sVar1 == 10) {
        uVar3 = ntohs(*(uint16_t *)(this->server_address_).__ss_padding);
        this->server_port_ = (uint)uVar3;
      }
      bVar2 = initializeSocket(in_stack_000001d8);
      uVar7 = CONCAT71(extraout_var,bVar2);
      if (bVar2) {
        uVar5 = this->flags_ & 1;
        if (uVar5 == 0) {
          uVar5 = (*(this->super_Transport)._vptr_Transport[6])();
        }
        uVar7 = (ulong)uVar5;
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
    }
  }
  return (int)CONCAT71((int7)(uVar7 >> 8),local_1);
}

Assistant:

bool TransportTCP::listen(int port, int backlog, const AcceptCallback& accept_cb)
{
  is_server_ = true;
  accept_cb_ = accept_cb;

  if (s_use_ipv6_)
  {
    sock_ = socket(AF_INET6, SOCK_STREAM, 0);
    sockaddr_in6 *address = (sockaddr_in6 *)&server_address_;
    address->sin6_family = AF_INET6;
    address->sin6_addr = isOnlyLocalhostAllowed() ? 
                         in6addr_loopback : 
                         in6addr_any;
    address->sin6_port = htons(port);
    sa_len_ = sizeof(sockaddr_in6);
  }
  else
  {
    sock_ = socket(AF_INET, SOCK_STREAM, 0);
    sockaddr_in *address = (sockaddr_in *)&server_address_;
    address->sin_family = AF_INET;
    address->sin_addr.s_addr = isOnlyLocalhostAllowed() ? 
                               htonl(INADDR_LOOPBACK) : 
                               INADDR_ANY;
    address->sin_port = htons(port);
    sa_len_ = sizeof(sockaddr_in);
  }

  if (sock_ == ROS_INVALID_SOCKET)
  {
    MINIROS_ERROR("socket() failed with error [%s]", last_socket_error_string());
    return false;
  }


  if (bind(sock_, (sockaddr *)&server_address_, sa_len_) < 0)
  {
    MINIROS_ERROR("bind() failed with error [%s]", last_socket_error_string());
    return false;
  }

  ::listen(sock_, backlog);
  getsockname(sock_, (sockaddr *)&server_address_, &sa_len_);

  switch (server_address_.ss_family)
  {
    case AF_INET:
      server_port_ = ntohs(((sockaddr_in *)&server_address_)->sin_port);
      break;
    case AF_INET6:
      server_port_ = ntohs(((sockaddr_in6 *)&server_address_)->sin6_port);
      break;
  }

  if (!initializeSocket())
  {
    return false;
  }

  if (!(flags_ & SYNCHRONOUS))
  {
    enableRead();
  }

  return true;
}